

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O1

void __thiscall crnlib::qdxt5::optimize_selectors_task(qdxt5 *this,uint64 data,void *pData_ptr)

{
  uint uVar1;
  dxt_pixel_block *pdVar2;
  dxt5_block *pdVar3;
  qdxt5 *pqVar4;
  bool bVar5;
  int iVar6;
  crn_thread_id_t cVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint y;
  long lVar15;
  dxt5_block blk;
  vector<unsigned_int> block_categories [2];
  uint values [8];
  undefined8 local_e0;
  qdxt5 *local_d8;
  long local_d0;
  long local_c8;
  int local_bc;
  vector<unsigned_int> local_b8;
  vector<unsigned_int> local_a8;
  ulong local_90;
  uint64 local_88;
  long *local_80;
  long local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  uint local_58 [10];
  
  local_a8.m_p = (uint *)0x0;
  local_a8.m_size = 0;
  local_a8.m_capacity = 0;
  local_b8.m_p = (uint *)0x0;
  local_b8.m_size = 0;
  local_b8.m_capacity = 0;
  local_d8 = this;
  vector<unsigned_int>::reserve(&local_b8,0x800);
  vector<unsigned_int>::reserve(&local_a8,0x800);
  if (*(int *)(*pData_ptr + 8) != 0) {
    uVar13 = 0;
    do {
      if ((local_d8->m_canceled != false) ||
         ((((char)uVar13 == '\0' &&
           (cVar7 = crn_get_current_thread_id(), cVar7 == local_d8->m_main_thread_id)) &&
          (bVar5 = update_progress(local_d8,(uint)uVar13,*(int *)(*pData_ptr + 8) - 1), !bVar5))))
      break;
      pqVar4 = local_d8;
      uVar1 = local_d8->m_pTask_pool->m_num_threads;
      if ((uVar1 == 0) || ((int)((uVar13 & 0xffffffff) % (ulong)(uVar1 + 1)) == (int)data)) {
        if (1 < *(uint *)(**pData_ptr + 8 + uVar13 * 0x10)) {
          local_90 = uVar13;
          if (local_b8.m_size != 0) {
            local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
          }
          local_88 = data;
          local_80 = (long *)pData_ptr;
          if (local_a8.m_size != 0) {
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
          }
          plVar11 = (long *)(**pData_ptr + uVar13 * 0x10);
          if ((int)plVar11[1] != 0) {
            uVar13 = 0;
            do {
              uVar10 = *(uint *)(*plVar11 + uVar13 * 4);
              uVar9 = pqVar4->m_elements_per_block * uVar10;
              bVar5 = pqVar4->m_pDst_elements[uVar9].m_endpoints[0] <=
                      pqVar4->m_pDst_elements[uVar9].m_endpoints[1];
              if ((&local_b8)[bVar5].m_capacity <= (&local_b8)[bVar5].m_size) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)(&local_b8 + bVar5),(&local_b8)[bVar5].m_size + 1,
                           true,4,(object_mover)0x0,false);
              }
              (&local_b8)[bVar5].m_p[(&local_b8)[bVar5].m_size] = uVar10;
              (&local_b8)[bVar5].m_size = (&local_b8)[bVar5].m_size + 1;
              uVar13 = uVar13 + 1;
            } while (uVar13 < *(uint *)(plVar11 + 1));
          }
          local_e0 = 0;
          lVar12 = 0;
          do {
            lVar15 = lVar12;
            if (1 < (&local_b8)[lVar12].m_size) {
              local_78 = lVar12;
              lVar15 = 0;
              do {
                local_70 = lVar15 * 4;
                local_d0 = 0;
                do {
                  local_c8 = 0;
                  uVar13 = 0xffffffffff;
                  iVar6 = 0;
                  do {
                    local_68 = uVar13;
                    local_bc = iVar6;
                    if ((&local_b8)[lVar12].m_size == 0) {
                      uVar14 = 0;
                    }
                    else {
                      uVar13 = 0;
                      uVar14 = 0;
                      do {
                        local_60 = uVar14;
                        uVar10 = (&local_b8)[lVar12].m_p[uVar13];
                        pdVar2 = pqVar4->m_pBlocks;
                        uVar9 = pqVar4->m_elements_per_block * uVar10;
                        dxt5_block::get_block_values
                                  (local_58,(uint)pqVar4->m_pDst_elements[uVar9].m_endpoints[0],
                                   (uint)pqVar4->m_pDst_elements[uVar9].m_endpoints[1]);
                        iVar6 = (uint)pdVar2[uVar10].m_pixels[lVar15][local_d0].field_0.c
                                      [(pqVar4->m_params).m_comp_index] - local_58[local_c8];
                        uVar14 = local_60 + (uint)(iVar6 * iVar6);
                        uVar13 = uVar13 + 1;
                      } while (uVar13 < (&local_b8)[lVar12].m_size);
                    }
                    uVar13 = local_68;
                    iVar6 = local_bc;
                    if (uVar14 < local_68) {
                      uVar13 = uVar14;
                      iVar6 = (int)local_c8;
                    }
                    local_c8 = local_c8 + 1;
                  } while (local_c8 != 8);
                  uVar13 = local_d0 + local_70;
                  uVar10 = (int)uVar13 * 3;
                  uVar14 = (ulong)(uVar10 >> 3);
                  bVar8 = *(byte *)((long)&local_e0 + uVar14 + 2);
                  uVar9 = (uint)bVar8;
                  if (uVar13 < 0xe) {
                    uVar9 = (uint)CONCAT11(*(undefined1 *)((long)&local_e0 + uVar14 + 3),bVar8);
                  }
                  bVar8 = (byte)uVar10 & 7;
                  uVar10 = iVar6 << bVar8 | ~(7 << bVar8) & uVar9;
                  *(char *)((long)&local_e0 + uVar14 + 2) = (char)uVar10;
                  if (uVar13 < 0xe) {
                    *(char *)((long)&local_e0 + uVar14 + 3) = (char)(uVar10 >> 8);
                  }
                  local_d0 = local_d0 + 1;
                } while (local_d0 != 4);
                lVar15 = lVar15 + 1;
              } while (lVar15 != 4);
              lVar15 = local_78;
              if ((&local_b8)[lVar12].m_size != 0) {
                uVar13 = 0;
                do {
                  uVar10 = pqVar4->m_elements_per_block * (&local_b8)[lVar12].m_p[uVar13];
                  pdVar3 = pqVar4->m_pDst_elements;
                  *(undefined2 *)(pdVar3[uVar10].m_selectors + 4) = local_e0._6_2_;
                  *(undefined4 *)pdVar3[uVar10].m_selectors = local_e0._2_4_;
                  uVar13 = uVar13 + 1;
                } while (uVar13 < (&local_b8)[lVar12].m_size);
              }
            }
            lVar12 = lVar15 + 1;
            uVar13 = local_90;
            pData_ptr = local_80;
            data = local_88;
          } while (lVar15 == 0);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < *(uint *)(*pData_ptr + 8));
  }
  lVar12 = 0x20;
  do {
    if (*(void **)((long)&local_c8 + lVar12) != (void *)0x0) {
      crnlib_free(*(void **)((long)&local_c8 + lVar12));
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  return;
}

Assistant:

void qdxt5::optimize_selectors_task(uint64 data, void* pData_ptr)
    {
        const uint thread_index = static_cast<uint>(data);

        optimize_selectors_params& task_params = *static_cast<optimize_selectors_params*>(pData_ptr);

        crnlib::vector<uint> block_categories[2];
        block_categories[0].reserve(2048);
        block_categories[1].reserve(2048);

        for (uint cluster_index = 0; cluster_index < task_params.m_selector_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & 255) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, task_params.m_selector_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& selector_indices = task_params.m_selector_cluster_indices[cluster_index];

            if (selector_indices.size() <= 1)
            {
                continue;
            }

            block_categories[0].resize(0);
            block_categories[1].resize(0);

            for (uint block_iter = 0; block_iter < selector_indices.size(); block_iter++)
            {
                const uint block_index = selector_indices[block_iter];

                const dxt5_block& src_block = get_block(block_index);

                block_categories[src_block.is_alpha6_block()].push_back(block_index);
            }

            dxt5_block blk;
            utils::zero_object(blk);

            for (uint block_type = 0; block_type <= 1; block_type++)
            {
                const crnlib::vector<uint>& block_indices = block_categories[block_type];
                if (block_indices.size() <= 1)
                {
                    continue;
                }

                for (uint y = 0; y < cDXTBlockSize; y++)
                {
                    for (uint x = 0; x < cDXTBlockSize; x++)
                    {
                        uint best_s = 0;
                        uint64 best_error = 0xFFFFFFFFFFULL;

                        for (uint s = 0; s < dxt5_block::cMaxSelectorValues; s++)
                        {
                            uint64 total_error = 0;

                            for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                            {
                                const uint block_index = block_indices[block_iter];

                                const color_quad_u8& orig_color = m_pBlocks[block_index].m_pixels[y][x];

                                const dxt5_block& dst_block = get_block(block_index);

                                uint values[dxt5_block::cMaxSelectorValues];
                                dxt5_block::get_block_values(values, dst_block.get_low_alpha(), dst_block.get_high_alpha());

                                int error = math::square((int)orig_color[m_params.m_comp_index] - (int)values[s]);

                                total_error += error;
                            }

                            if (total_error < best_error)
                            {
                                best_error = total_error;
                                best_s = s;
                            }
                        }

                        blk.set_selector(x, y, best_s);

                    } // x
                } // y

                for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                {
                    const uint block_index = block_indices[block_iter];

                    dxt5_block& dst_block = get_block(block_index);

                    memcpy(dst_block.m_selectors, blk.m_selectors, sizeof(dst_block.m_selectors));
                }
            }

        } // cluster_index
    }